

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O2

int __thiscall deqp::egl::PartialUpdateTests::init(PartialUpdateTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *pEVar1;
  TestNode *pTVar2;
  int extraout_EAX;
  PartialUpdateTest *pPVar3;
  allocator_type *in_RCX;
  allocator_type *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a_00;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *drawTypes;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *drawTypes_00;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *extraout_RDX;
  char *in_R9;
  allocator_type *paVar4;
  _anonymous_namespace_ *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  _anonymous_namespace_ *local_110;
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  frameDrawTypes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _anonymous_namespace_ *local_c8;
  TestNode *local_c0;
  allocator_type *local_b8;
  DrawType renderClear [2];
  DrawType clearRender [2];
  pointer local_a0;
  allocator_type *local_98;
  string name;
  string local_70;
  string local_50;
  
  clearRender[0] = DRAWTYPE_GLES2_CLEAR;
  clearRender[1] = DRAWTYPE_GLES2_RENDER;
  renderClear[0] = DRAWTYPE_GLES2_RENDER;
  renderClear[1] = DRAWTYPE_GLES2_CLEAR;
  frameDrawTypes.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  frameDrawTypes.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  frameDrawTypes.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138._M_dataplus._M_p = (pointer)0x0;
  local_138._M_string_length = 0;
  local_138.field_2._M_allocated_capacity = 0;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&local_138);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                   *)&local_138);
  local_e8._M_dataplus._M_p._0_4_ = 0;
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
            *)&local_138,1,(value_type *)&local_e8,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&local_138);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                   *)&local_138);
  local_e8._M_dataplus._M_p._0_4_ = 1;
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
            *)&local_138,1,(value_type *)&local_e8,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&local_138);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                   *)&local_138);
  local_e8._M_dataplus._M_p._0_4_ = 0;
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
            *)&local_138,2,(value_type *)&local_e8,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&local_138);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                   *)&local_138);
  local_e8._M_dataplus._M_p._0_4_ = 1;
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
            *)&local_138,2,(value_type *)&local_e8,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&local_138);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                   *)&local_138);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>>
              *)&local_138,clearRender,(DrawType *)&local_a0,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&local_138);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                   *)&local_138);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>>
              *)&local_138,renderClear,clearRender,in_RCX);
  local_c0 = (TestNode *)this;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&local_138);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                   *)&local_138);
  local_98 = (allocator_type *)
             (((long)frameDrawTypes.
                     super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)frameDrawTypes.
                    super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  drawTypes = (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
               *)(((long)frameDrawTypes.
                         super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)frameDrawTypes.
                        super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) % 0x18);
  __a = (allocator_type *)0x0;
  local_a0 = frameDrawTypes.
             super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = (_anonymous_namespace_ *)
             frameDrawTypes.
             super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    paVar4 = __a;
    if (__a < local_98) {
      paVar4 = local_98;
    }
    if (local_98 == __a) break;
    local_110 = (_anonymous_namespace_ *)(local_a0 + (long)__a);
    this_00 = local_c8;
    local_b8 = __a;
    for (; local_b8 != paVar4; paVar4 = paVar4 + -1) {
      egl::(anonymous_namespace)::generateDrawTypeName_abi_cxx11_(&local_50,this_00,drawTypes);
      std::operator+(&local_e8,"odd",&local_50);
      std::operator+(&local_138,&local_e8,"_even");
      egl::(anonymous_namespace)::generateDrawTypeName_abi_cxx11_(&local_70,local_110,drawTypes_00);
      std::operator+(&name,&local_138,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_50);
      if ((*(long *)(this_00 + 8) != *(long *)this_00) ||
         (*(long *)(local_110 + 8) != *(long *)local_110)) {
        pPVar3 = (PartialUpdateTest *)operator_new(0x1b18);
        pTVar2 = local_c0;
        egl::anon_unknown_0::PartialUpdateTest::PartialUpdateTest
                  (pPVar3,(EglTestContext *)local_c0[1]._vptr_TestNode,
                   (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                    *)this_00,
                   (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                    *)local_110,name._M_dataplus._M_p,in_R9);
        tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar3);
      }
      std::__cxx11::string::~string((string *)&name);
      this_00 = this_00 + 0x18;
      drawTypes = extraout_RDX;
    }
    __a = local_b8 + 1;
    local_c8 = local_c8 + 0x18;
  }
  pPVar3 = (PartialUpdateTest *)operator_new(0x1b18);
  pTVar2 = local_c0;
  pEVar1 = (EglTestContext *)local_c0[1]._vptr_TestNode;
  local_50._M_dataplus._M_p._0_4_ = 1;
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
            *)&local_138,1,(value_type *)&local_50,__a);
  local_70._M_dataplus._M_p._0_4_ = 1;
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
            *)&local_e8,1,(value_type *)&local_70,__a);
  __a_00 = &local_e8;
  egl::anon_unknown_0::PartialUpdateTest::PartialUpdateTest
            (pPVar3,pEVar1,
             (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
              *)&local_138,
             (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
              *)__a_00,"render_outside_damage_region",in_R9);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                   *)&local_e8);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                   *)&local_138);
  (pPVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PartialUpdateTest_01e0f8a0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar3);
  pPVar3 = (PartialUpdateTest *)operator_new(0x1b18);
  pEVar1 = (EglTestContext *)pTVar2[1]._vptr_TestNode;
  local_50._M_dataplus._M_p._0_4_ = 1;
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
            *)&local_138,1,(value_type *)&local_50,(allocator_type *)__a_00);
  local_70._M_dataplus._M_p._0_4_ = 1;
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
            *)&local_e8,1,(value_type *)&local_70,(allocator_type *)__a_00);
  egl::anon_unknown_0::PartialUpdateTest::PartialUpdateTest
            (pPVar3,pEVar1,
             (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
              *)&local_138,
             (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
              *)&local_e8,"render_before_set_damage_region",in_R9);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                   *)&local_e8);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                   *)&local_138);
  (pPVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PartialUpdateTest_01e0f8f0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar3);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::~vector(&frameDrawTypes);
  return extraout_EAX;
}

Assistant:

void PartialUpdateTests::init (void)
{
	const PartialUpdateTest::DrawType clearRender[2] =
	{
		PartialUpdateTest::DRAWTYPE_GLES2_CLEAR,
		PartialUpdateTest::DRAWTYPE_GLES2_RENDER
	};

	const PartialUpdateTest::DrawType renderClear[2] =
	{
		PartialUpdateTest::DRAWTYPE_GLES2_RENDER,
		PartialUpdateTest::DRAWTYPE_GLES2_CLEAR
	};

	vector< vector<PartialUpdateTest::DrawType> > frameDrawTypes;
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> ());
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (1, PartialUpdateTest::DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (1, PartialUpdateTest::DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (2, PartialUpdateTest::DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (2, PartialUpdateTest::DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (DE_ARRAY_BEGIN(clearRender), DE_ARRAY_END(clearRender)));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (DE_ARRAY_BEGIN(renderClear), DE_ARRAY_END(renderClear)));

	for (size_t evenNdx = 0; evenNdx < frameDrawTypes.size(); evenNdx++)
	{
		const vector<PartialUpdateTest::DrawType>& evenFrameDrawType = frameDrawTypes[evenNdx];

		for (size_t oddNdx = evenNdx; oddNdx < frameDrawTypes.size(); oddNdx++)
		{
			const vector<PartialUpdateTest::DrawType>&	oddFrameDrawType = frameDrawTypes[oddNdx];
			const std::string							name			 = generateTestName(oddFrameDrawType, evenFrameDrawType);
			if (oddFrameDrawType.size() == 0 && evenFrameDrawType.size() == 0)
				continue;

			addChild(new PartialUpdateTest(m_eglTestCtx, oddFrameDrawType, evenFrameDrawType, name.c_str(), ""));
		}
	}
	addChild(new RenderOutsideDamageRegion(m_eglTestCtx));
	addChild(new RenderBeforeSetDamageRegion(m_eglTestCtx));
}